

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fragment.cpp
# Opt level: O2

bool pstore::repo::fragment::fragment_appears_valid
               (fragment *f,extent<pstore::repo::fragment> *fext)

{
  member_array *this;
  ulong offset;
  size_t sVar1;
  bool bVar2;
  uint uVar3;
  value_type *pvVar4;
  uint64_t *puVar5;
  ulong min_offset;
  section_kind k;
  size_t size;
  const_iterator cVar6;
  const_iterator cVar7;
  indices indices;
  const_iterator local_48;
  section_kind local_38;
  
  bVar2 = std::operator!=(&f->signature_,&fragment_signature_);
  if (((bVar2) || (indices.i_.bitmap_ = (indices)(f->arr_).sa_.bitmap_, indices.i_.bitmap_ == 0)) ||
     (uVar3 = sparse_array<unsigned_long,_unsigned_int>::indices::back(&indices.i_),
     0x12 < (byte)uVar3)) {
LAB_001a7d9b:
    bVar2 = false;
  }
  else {
    this = &f->arr_;
    cVar6 = sparse_array<unsigned_long,_unsigned_int>::indices::begin(&indices.i_);
    local_48.pos_ = cVar6.pos_;
    local_48.bitmap_ = cVar6.bitmap_;
    cVar6 = sparse_array<unsigned_long,_unsigned_int>::indices::end(&indices.i_);
    min_offset = 0x20;
    while (sVar1 = local_48.pos_, local_48.bitmap_ != cVar6.bitmap_) {
      k = (section_kind)local_48.pos_;
      local_38 = k;
      pvVar4 = section_sparray<unsigned_long>::operator[](this,k);
      offset = *pvVar4;
      uVar3 = sparse_array<unsigned_long,_unsigned_int>::indices::back(&indices.i_);
      puVar5 = &fext->size;
      if (k != (section_kind)uVar3) {
        cVar7 = sparse_array<unsigned_long,_unsigned_int>::indices::const_iterator::operator+
                          (&local_48,1);
        puVar5 = section_sparray<unsigned_long>::operator[](this,(section_kind)cVar7.pos_);
      }
      if ((offset < min_offset) || (size = *puVar5 - offset, *puVar5 < offset || size == 0))
      goto LAB_001a7d9b;
      if (((debug_string|debug_loc) < k) ||
         ((1 << (k & (debug_string|debug_loc)) & (this->sa_).bitmap_) == 0)) {
        assert_failed("f.has_section (kind)",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/mcrepo/fragment.cpp"
                      ,0x96);
      }
      switch(sVar1 & 0xff) {
      case 0:
        min_offset = section_offset_is_valid<(pstore::repo::section_kind)0,pstore::repo::generic_section>
                               (f,fext,min_offset,offset,size);
        break;
      case 1:
        min_offset = section_offset_is_valid<(pstore::repo::section_kind)1,pstore::repo::generic_section>
                               (f,fext,min_offset,offset,size);
        break;
      case 2:
        min_offset = section_offset_is_valid<(pstore::repo::section_kind)2,pstore::repo::bss_section>
                               (f,fext,min_offset,offset,size);
        break;
      case 3:
        min_offset = section_offset_is_valid<(pstore::repo::section_kind)3,pstore::repo::generic_section>
                               (f,fext,min_offset,offset,size);
        break;
      case 4:
        min_offset = section_offset_is_valid<(pstore::repo::section_kind)4,pstore::repo::generic_section>
                               (f,fext,min_offset,offset,size);
        break;
      case 5:
        min_offset = section_offset_is_valid<(pstore::repo::section_kind)5,pstore::repo::generic_section>
                               (f,fext,min_offset,offset,size);
        break;
      case 6:
        min_offset = section_offset_is_valid<(pstore::repo::section_kind)6,pstore::repo::generic_section>
                               (f,fext,min_offset,offset,size);
        break;
      case 7:
        min_offset = section_offset_is_valid<(pstore::repo::section_kind)7,pstore::repo::generic_section>
                               (f,fext,min_offset,offset,size);
        break;
      case 8:
        min_offset = section_offset_is_valid<(pstore::repo::section_kind)8,pstore::repo::generic_section>
                               (f,fext,min_offset,offset,size);
        break;
      case 9:
        min_offset = section_offset_is_valid<(pstore::repo::section_kind)9,pstore::repo::generic_section>
                               (f,fext,min_offset,offset,size);
        break;
      case 10:
        min_offset = section_offset_is_valid<(pstore::repo::section_kind)10,pstore::repo::generic_section>
                               (f,fext,min_offset,offset,size);
        break;
      case 0xb:
        min_offset = section_offset_is_valid<(pstore::repo::section_kind)11,pstore::repo::generic_section>
                               (f,fext,min_offset,offset,size);
        break;
      case 0xc:
        min_offset = section_offset_is_valid<(pstore::repo::section_kind)12,pstore::repo::generic_section>
                               (f,fext,min_offset,offset,size);
        break;
      case 0xd:
        min_offset = section_offset_is_valid<(pstore::repo::section_kind)13,pstore::repo::generic_section>
                               (f,fext,min_offset,offset,size);
        break;
      case 0xe:
        min_offset = section_offset_is_valid<(pstore::repo::section_kind)14,pstore::repo::debug_line_section>
                               (f,fext,min_offset,offset,size);
        break;
      case 0xf:
        min_offset = section_offset_is_valid<(pstore::repo::section_kind)15,pstore::repo::generic_section>
                               (f,fext,min_offset,offset,size);
        break;
      case 0x10:
        min_offset = section_offset_is_valid<(pstore::repo::section_kind)16,pstore::repo::generic_section>
                               (f,fext,min_offset,offset,size);
        break;
      case 0x11:
        min_offset = section_offset_is_valid<(pstore::repo::section_kind)17,pstore::repo::generic_section>
                               (f,fext,min_offset,offset,size);
        break;
      case 0x12:
        min_offset = section_offset_is_valid<(pstore::repo::section_kind)18,pstore::repo::linked_definitions>
                               (f,fext,min_offset,offset,size);
        break;
      case 0x13:
        assert_failed("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/mcrepo/fragment.cpp"
                      ,0x9f);
      default:
        goto switchD_001a7e7d_default;
      }
      if (min_offset == 0) goto LAB_001a7d9b;
switchD_001a7e7d_default:
      sparse_array<unsigned_long,_unsigned_int>::indices::const_iterator::operator++(&local_48);
    }
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool fragment::fragment_appears_valid (fragment const & f, pstore::extent<fragment> const & fext) {
#if PSTORE_SIGNATURE_CHECKS_ENABLED
    if (f.signature_ != fragment_signature_) {
        return false;
    }
#endif // PSTORE_SIGNATURE_CHECKS_ENABLED

    auto const indices = f.arr_.get_indices ();
    if (indices.empty () || indices.back () >= section_kind::last) {
        return false;
    }

    std::uint64_t offset = sizeof (fragment);
    for (auto index_it = std::begin (indices), index_end = std::end (indices);
         index_it != index_end; ++index_it) {
        section_kind const index = *index_it;

        auto const this_offset = f.arr_[index];
        auto const next_offset = (index == indices.back ()) ? fext.size : f.arr_[*(index_it + 1)];
        if (this_offset < offset || next_offset <= this_offset) {
            return false;
        }

        section_kind const kind = static_cast<section_kind> (index);
        PSTORE_ASSERT (f.has_section (kind));
#define X(k)                                                                                       \
    case section_kind::k:                                                                          \
        offset = fragment::section_offset_is_valid<section_kind::k> (f, fext, offset, this_offset, \
                                                                     next_offset - this_offset);   \
        break;

        switch (kind) {
            PSTORE_MCREPO_SECTION_KINDS
        case repo::section_kind::last: PSTORE_ASSERT (false); break;
        }
#undef X
        if (offset == 0) {
            return false;
        }
    }

    return true;
}